

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirIfInternal(char *dirName,aint val)

{
  bool bVar1;
  byte local_96;
  byte local_95;
  EReturn local_90;
  uint local_8c;
  int local_88;
  aint orVal;
  aint elseCounter;
  EReturn ret;
  size_t i;
  char errorsTxt [2] [48];
  aint val_local;
  char *dirName_local;
  
  errorsTxt[1]._44_4_ = val;
  for (_elseCounter = 0; _elseCounter < 2; _elseCounter = _elseCounter + 1) {
    snprintf(errorsTxt[_elseCounter - 1] + 0x28,0x30,dirIfErrorsTxtSrc[_elseCounter],dirName);
  }
  ListFile(false);
  orVal = 0;
  local_88 = 0;
  local_8c = 0;
  while( true ) {
    do {
      while( true ) {
        if (orVal == 2) {
          return;
        }
        local_8c = errorsTxt[1]._44_4_ | local_8c;
        if (errorsTxt[1]._44_4_ == 0) {
          local_90 = SkipFile();
        }
        else {
          local_90 = ReadFile();
        }
        orVal = local_90;
        if (local_90 != ELSE) break;
        if (local_88 != 0) {
          Error(errorsTxt[0] + 0x28,(char *)0x0,PASS3);
        }
        local_95 = 0;
        if (errorsTxt[1]._44_4_ == 0) {
          local_95 = local_8c != 0 ^ 0xff;
        }
        errorsTxt[1]._44_4_ = ZEXT14(local_95 & 1);
        local_88 = local_88 + 1;
      }
    } while (local_90 == ENDIF);
    if (local_90 != ELSEIF) break;
    local_96 = 0;
    if (errorsTxt[1]._44_4_ == 0) {
      local_96 = local_8c != 0 ^ 0xff;
    }
    errorsTxt[1]._44_4_ = ZEXT14(local_96 & 1);
    if ((errorsTxt[1]._44_4_ != 0) && (bVar1 = dirIfIfn((aint *)(errorsTxt[1] + 0x2c)), !bVar1)) {
      errorsTxt[1][0x2c] = '\0';
      errorsTxt[1][0x2d] = '\0';
      errorsTxt[1][0x2e] = '\0';
      errorsTxt[1][0x2f] = '\0';
      local_8c = 1;
    }
  }
  if (IsRunning != 0) {
    Error((char *)&i,(char *)0x0,PASS3);
  }
  donotlist = (uint)((IsRunning != 0 ^ 0xffU) & 1);
  return;
}

Assistant:

static void dirIfInternal(const char* dirName, aint val) {
	// set up error messages for the particular pseudo-op
	char errorsTxt[dirIfErrorsN][dirIfErrorsSZ];
	for (size_t i = 0; i < dirIfErrorsN; ++i) {
		SPRINTF1(errorsTxt[i], dirIfErrorsSZ, dirIfErrorsTxtSrc[i], dirName);
	}
	// do the IF**some** part
	ListFile();
	EReturn ret = END;
	aint elseCounter = 0;
	aint orVal = false;
	while (ENDIF != ret) {
		orVal |= val;
		switch (ret = val ? ReadFile() : SkipFile()) {
			case ELSE:
				if (elseCounter++) Error(errorsTxt[1]);
				val = !val && !orVal;
				break;
			case ELSEIF:
				val = !val && !orVal;
				if (val) {		// active ELSEIF, evaluate expression
					if (!dirIfIfn(val)) {
						val = false;		// syntax error in expression
						orVal = true;		// force remaining IF-blocks inactive
					}
				}
				break;
			case ENDIF:
				break;
			default:
				if (IsRunning) Error(errorsTxt[0]);
				donotlist=!IsRunning;		// do the listing only if still running
				return;
		}
	}
}